

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Clara::Opt::Opt(Opt *this,bool *ref)

{
  ParserRefImpl<Catch::Clara::Opt> *in_RDI;
  shared_ptr<Catch::Clara::Detail::BoundFlagRef> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd8;
  
  __r = (shared_ptr<Catch::Clara::Detail::BoundFlagRef> *)&stack0xffffffffffffffd0;
  std::make_shared<Catch::Clara::Detail::BoundFlagRef,bool&>
            ((bool *)in_stack_ffffffffffffffd8._M_pi);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::
  shared_ptr<Catch::Clara::Detail::BoundFlagRef,void>
            ((shared_ptr<Catch::Clara::Detail::BoundRef> *)in_RDI,__r);
  Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            (in_RDI,(shared_ptr<Catch::Clara::Detail::BoundRef> *)__r);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::~shared_ptr
            ((shared_ptr<Catch::Clara::Detail::BoundRef> *)0x185f79);
  std::shared_ptr<Catch::Clara::Detail::BoundFlagRef>::~shared_ptr
            ((shared_ptr<Catch::Clara::Detail::BoundFlagRef> *)0x185f83);
  (in_RDI->super_ComposableParserImpl<Catch::Clara::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_002a6228;
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)0x185f9f);
  return;
}

Assistant:

Opt::Opt(bool& ref) :
            ParserRefImpl(std::make_shared<Detail::BoundFlagRef>(ref)) {}